

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void __thiscall FSlide::HitSlideLine(FSlide *this,line_t *ld)

{
  AActor *pAVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool local_141;
  double inter3;
  double inter2;
  double inter1;
  divline_t dlv;
  divline_t dll;
  FSoundID local_d4;
  TAngle<double> local_d0;
  TAngle<double> local_c8;
  undefined1 local_c0 [24];
  undefined1 local_a8 [24];
  undefined1 local_90 [8];
  DVector3 pos;
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  double dStack_40;
  bool icyfloor;
  double movelen;
  DAngle deltaangle;
  DAngle moveangle;
  DAngle lineangle;
  int side;
  line_t *ld_local;
  FSlide *this_local;
  
  TAngle<double>::TAngle(&moveangle);
  TAngle<double>::TAngle(&deltaangle);
  TAngle<double>::TAngle((TAngle<double> *)&movelen);
  dVar4 = TVector2<double>::LengthSquared(&this->tmmove);
  local_141 = false;
  if (16.0 < dVar4) {
    bVar2 = FBoolCVar::operator_cast_to_bool(&var_friction);
    local_141 = false;
    if (bVar2) {
      dVar4 = AActor::Z(this->slidemo);
      local_141 = false;
      if (dVar4 <= this->slidemo->floorz) {
        dVar4 = P_GetFriction(this->slidemo,(double *)0x0);
        local_141 = 0.90625 < dVar4;
      }
    }
  }
  local_58[0x17] = local_141;
  line_t::Delta((line_t *)local_58);
  if (((double)local_58._0_8_ != 0.0) || (NAN((double)local_58._0_8_))) {
    line_t::Delta((line_t *)local_70);
    if (((double)local_70._8_8_ != 0.0) || (NAN((double)local_70._8_8_))) {
      AActor::PosRelative((DVector3 *)local_90,this->slidemo,ld);
      TVector2<double>::TVector2((TVector2<double> *)(local_a8 + 8),(TVector3<double> *)local_90);
      iVar3 = P_PointOnLineSide((DVector2 *)(local_a8 + 8),ld);
      line_t::Delta((line_t *)(local_c0 + 8));
      TVector2<double>::Angle((TVector2<double> *)local_a8);
      TAngle<double>::operator=(&moveangle,(TAngle<double> *)local_a8);
      if (iVar3 == 1) {
        TAngle<double>::operator+=(&moveangle,180.0);
      }
      TVector2<double>::Angle((TVector2<double> *)local_c0);
      TAngle<double>::operator=(&deltaangle,(TAngle<double> *)local_c0);
      TAngle<double>::operator+=(&deltaangle,3600.0);
      deltaangle<double>(&local_c8,&moveangle);
      TAngle<double>::operator=((TAngle<double> *)&movelen,&local_c8);
      dStack_40 = TVector2<double>::Length(&this->tmmove);
      if ((((local_58[0x17] & 1) == 0) ||
          (bVar2 = TAngle<double>::operator>((TAngle<double> *)&movelen,45.0), !bVar2)) ||
         (bVar2 = TAngle<double>::operator<((TAngle<double> *)&movelen,135.0), !bVar2)) {
        P_MakeDivline(ld,(divline_t *)&dlv.dy);
        inter1 = (double)local_90;
        dlv.x = pos.X;
        dlv.y = dll.dx;
        dlv.dx = -dll.y;
        dVar4 = P_InterceptVector((divline_t *)&dlv.dy,(divline_t *)&inter1);
        dlv.y = (this->tmmove).X;
        dlv.dx = (this->tmmove).Y;
        dVar5 = P_InterceptVector((divline_t *)&dlv.dy,(divline_t *)&inter1);
        dVar6 = P_InterceptVector((divline_t *)&inter1,(divline_t *)&dlv.dy);
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          (this->tmmove).X = ((dVar5 - dVar4) * dll.y) / dVar6;
          (this->tmmove).Y = ((dVar5 - dVar4) * dll.dx) / dVar6;
        }
        else {
          TVector2<double>::Zero(&this->tmmove);
        }
      }
      else {
        deltaangle<double>(&local_d0,(TAngle<double> *)&movelen);
        TAngle<double>::operator=(&deltaangle,&local_d0);
        dStack_40 = dStack_40 / 2.0;
        if (((this->slidemo->player != (player_t *)0x0) && (0 < this->slidemo->health)) &&
           ((this->slidemo->player->cheats & 0x2000U) == 0)) {
          pAVar1 = this->slidemo;
          FSoundID::FSoundID(&local_d4,"*grunt");
          S_Sound(pAVar1,2,&local_d4,1.0,1.001);
        }
        TAngle<double>::ToVector((TAngle<double> *)&dll.dy,dStack_40);
        TVector2<double>::operator=(&this->tmmove,(TVector2<double> *)&dll.dy);
      }
    }
    else if (((local_58[0x17] & 1) == 0) || (ABS((this->tmmove).Y) <= ABS((this->tmmove).X))) {
      (this->tmmove).Y = 0.0;
    }
    else {
      (this->tmmove).X = (this->tmmove).X / 2.0;
      (this->tmmove).Y = -(this->tmmove).Y / 2.0;
      if (((this->slidemo->player != (player_t *)0x0) && (0 < this->slidemo->health)) &&
         ((this->slidemo->player->cheats & 0x2000U) == 0)) {
        pAVar1 = this->slidemo;
        FSoundID::FSoundID((FSoundID *)((long)&pos.Z + 4),"*grunt");
        S_Sound(pAVar1,2,(FSoundID *)((long)&pos.Z + 4),1.0,1.001);
      }
    }
  }
  else if (((local_58[0x17] & 1) == 0) || (ABS((this->tmmove).X) <= ABS((this->tmmove).Y))) {
    (this->tmmove).X = 0.0;
  }
  else {
    (this->tmmove).X = -(this->tmmove).X / 2.0;
    (this->tmmove).Y = (this->tmmove).Y / 2.0;
    if (((this->slidemo->player != (player_t *)0x0) && (0 < this->slidemo->health)) &&
       ((this->slidemo->player->cheats & 0x2000U) == 0)) {
      pAVar1 = this->slidemo;
      FSoundID::FSoundID((FSoundID *)(local_70 + 0x14),"*grunt");
      S_Sound(pAVar1,2,(FSoundID *)(local_70 + 0x14),1.0,1.001);
    }
  }
  return;
}

Assistant:

void FSlide::HitSlideLine(line_t* ld)
{
	int 	side;

	DAngle lineangle;
	DAngle moveangle;
	DAngle deltaangle;

	double movelen;
	bool	icyfloor;	// is floor icy?							// phares
	//   |
	// Under icy conditions, if the angle of approach to the wall	//   V
	// is more than 45 degrees, then you'll bounce and lose half
	// your velocity. If less than 45 degrees, you'll slide along
	// the wall. 45 is arbitrary and is believable.

	// Check for the special cases of horz or vert walls.

	// killough 10/98: only bounce if hit hard (prevents wobbling)
	icyfloor =
		tmmove.LengthSquared() > 4*4 &&
		var_friction &&  // killough 8/28/98: calc friction on demand
		slidemo->Z() <= slidemo->floorz &&
		P_GetFriction(slidemo, NULL) > ORIG_FRICTION;

	if (ld->Delta().X == 0)
	{ // ST_VERTICAL
		if (icyfloor && (fabs(tmmove.X) > fabs(tmmove.Y)))
		{
			tmmove.X = -tmmove.X / 2;
			tmmove.Y /= 2; // absorb half the velocity
			if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
			{
				S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!//   ^
			}
		}																		//   |
		else																	// phares
			tmmove.X = 0; // no more movement in the X direction
		return;
	}

	if (ld->Delta().Y == 0)
	{ // ST_HORIZONTAL
		if (icyfloor && (fabs(tmmove.Y) > fabs(tmmove.X)))
		{
			tmmove.X /= 2; // absorb half the velocity
			tmmove.Y = -tmmove.Y / 2;
			if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
			{
				S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!
			}
		}
		else
			tmmove.Y = 0; // no more movement in the Y direction
		return;
	}

	// The wall is angled. Bounce if the angle of approach is		// phares
	// less than 45 degrees.										// phares

	DVector3 pos = slidemo->PosRelative(ld);
	side = P_PointOnLineSide(pos, ld);

	lineangle = ld->Delta().Angle();

	if (side == 1)
		lineangle += 180.;

	moveangle = tmmove.Angle();

	// prevents sudden path reversal due to rounding error |	// phares
	moveangle += 3600/65536.*65536.;		// Boom added 10 to the angle here.
	
	deltaangle = ::deltaangle(lineangle, moveangle);								//   V
	movelen = tmmove.Length();
	if (icyfloor && (deltaangle > 45) && (deltaangle < 135))
	{
		moveangle = ::deltaangle(deltaangle, lineangle);
		movelen /= 2; // absorb
		if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
		{
			S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!
		}
		tmmove = moveangle.ToVector(movelen);
	}	
	else
	{	
		// The compatibility option that used to be here had to be removed because
		// with floating point math it was no longer possible to reproduce.

#if 0
		// with full precision this should work now. Needs some testing
		if (deltaangle < 0)	deltaangle += 180.;
		tmmove = lineangle.ToVector(movelen * deltaangle.Cos());
#else
		divline_t dll, dlv;
		double inter1, inter2, inter3;

		P_MakeDivline(ld, &dll);

		dlv.x = pos.X;
		dlv.y = pos.Y;
		dlv.dx = dll.dy;
		dlv.dy = -dll.dx;

		inter1 = P_InterceptVector(&dll, &dlv);

		dlv.dx = tmmove.X;
		dlv.dy = tmmove.Y;
		inter2 = P_InterceptVector(&dll, &dlv);
		inter3 = P_InterceptVector(&dlv, &dll);

		if (inter3 != 0)
		{
			tmmove.X = (inter2 - inter1) * dll.dx / inter3;
			tmmove.Y = (inter2 - inter1) * dll.dy / inter3;
		}
		else
		{
			tmmove.Zero();
		}
#endif
	}																// phares
}